

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O2

void edition_unittest::TestChildExtensionData::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  uint uVar1;
  size_t sVar2;
  MessageLite *from_msg_00;
  MessageLite *to_msg_00;
  char *pcVar3;
  undefined8 *puVar4;
  void *pvVar5;
  Arena *pAVar6;
  int line;
  Arena *arena;
  string_view value;
  string_view value_00;
  TestChildExtensionData *_this;
  TestChildExtensionData *local_30;
  MessageLite *local_28 [2];
  
  arena = (Arena *)(to_msg->_internal_metadata_).ptr_;
  if (((ulong)arena & 1) != 0) {
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  local_30 = (TestChildExtensionData *)to_msg;
  local_28[0] = from_msg;
  pcVar3 = absl::lts_20250127::log_internal::
           Check_NEImpl<edition_unittest::TestChildExtensionData_const*,edition_unittest::TestChildExtensionData*>
                     ((TestChildExtensionData **)local_28,&local_30,"&from != _this");
  if (pcVar3 == (Nullable<const_char_*>)0x0) {
    uVar1 = *(uint *)&from_msg[1]._vptr_MessageLite;
    if ((uVar1 & 7) != 0) {
      if ((uVar1 & 1) != 0) {
        puVar4 = (undefined8 *)(from_msg[1]._internal_metadata_.ptr_ & 0xfffffffffffffffc);
        pcVar3 = (char *)*puVar4;
        sVar2 = puVar4[1];
        (local_30->field_0)._impl_._has_bits_.has_bits_[0] =
             (local_30->field_0)._impl_._has_bits_.has_bits_[0] | 1;
        pAVar6 = (Arena *)(local_30->super_Message).super_MessageLite._internal_metadata_.ptr_;
        if (((ulong)pAVar6 & 1) != 0) {
          pAVar6 = *(Arena **)((ulong)pAVar6 & 0xfffffffffffffffe);
        }
        value._M_str = pcVar3;
        value._M_len = sVar2;
        google::protobuf::internal::ArenaStringPtr::Set(&(local_30->field_0)._impl_.a_,value,pAVar6)
        ;
      }
      if ((uVar1 & 2) != 0) {
        puVar4 = (undefined8 *)((ulong)from_msg[2]._vptr_MessageLite & 0xfffffffffffffffc);
        pcVar3 = (char *)*puVar4;
        sVar2 = puVar4[1];
        (local_30->field_0)._impl_._has_bits_.has_bits_[0] =
             (local_30->field_0)._impl_._has_bits_.has_bits_[0] | 2;
        pAVar6 = (Arena *)(local_30->super_Message).super_MessageLite._internal_metadata_.ptr_;
        if (((ulong)pAVar6 & 1) != 0) {
          pAVar6 = *(Arena **)((ulong)pAVar6 & 0xfffffffffffffffe);
        }
        value_00._M_str = pcVar3;
        value_00._M_len = sVar2;
        google::protobuf::internal::ArenaStringPtr::Set
                  (&(local_30->field_0)._impl_.b_,value_00,pAVar6);
      }
      if ((uVar1 & 4) != 0) {
        from_msg_00 = (MessageLite *)from_msg[2]._internal_metadata_.ptr_;
        if (from_msg_00 == (MessageLite *)0x0) {
          pcVar3 = "from._impl_.optional_extension_ != nullptr";
          line = 0x3c40;
          goto LAB_009b921b;
        }
        to_msg_00 = *(MessageLite **)((long)&local_30->field_0 + 0x18);
        if (to_msg_00 == (MessageLite *)0x0) {
          pvVar5 = google::protobuf::Arena::
                   CopyConstruct<edition_unittest::TestChildExtensionData_NestedTestAllExtensionsData>
                             (arena,from_msg_00);
          *(void **)((long)&local_30->field_0 + 0x18) = pvVar5;
        }
        else {
          TestChildExtensionData_NestedTestAllExtensionsData::MergeImpl(to_msg_00,from_msg_00);
        }
      }
    }
    (local_30->field_0)._impl_._has_bits_.has_bits_[0] =
         (local_30->field_0)._impl_._has_bits_.has_bits_[0] | uVar1;
    google::protobuf::internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
              (&(local_30->super_Message).super_MessageLite._internal_metadata_,
               &from_msg->_internal_metadata_);
    return;
  }
  line = 0x3c33;
LAB_009b921b:
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)local_28,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/google/protobuf/edition_unittest.pb.cc"
             ,line,pcVar3);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_28);
}

Assistant:

void TestChildExtensionData::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<TestChildExtensionData*>(&to_msg);
  auto& from = static_cast<const TestChildExtensionData&>(from_msg);
  ::google::protobuf::Arena* arena = _this->GetArena();
  // @@protoc_insertion_point(class_specific_merge_from_start:edition_unittest.TestChildExtensionData)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000007u) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      _this->_internal_set_a(from._internal_a());
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      _this->_internal_set_b(from._internal_b());
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      ABSL_DCHECK(from._impl_.optional_extension_ != nullptr);
      if (_this->_impl_.optional_extension_ == nullptr) {
        _this->_impl_.optional_extension_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.optional_extension_);
      } else {
        _this->_impl_.optional_extension_->MergeFrom(*from._impl_.optional_extension_);
      }
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}